

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcosId>_>
::WriteCon2JSON(ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcosId>_>
                *this,MemoryWriter *wrt,int i_con,Container *cnt)

{
  char *pcVar1;
  Container *in_RCX;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_RSI;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> jw;
  char **in_stack_fffffffffffffec8;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcosId>
  *in_stack_fffffffffffffee0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_ffffffffffffff08;
  string_view in_stack_ffffffffffffff10;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcosId>
  *in_stack_ffffffffffffff58;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_ffffffffffffff60;
  BasicConstraintKeeper *in_stack_ffffffffffffff80;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_30;
  Container *local_20;
  
  local_20 = in_RCX;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::MiniJSONWriter
            (&local_30,in_RSI);
  BasicConstraintKeeper::GetShortTypeName(in_stack_ffffffffffffff80);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x3e0b15);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            (in_stack_fffffffffffffed0,(int *)in_stack_fffffffffffffec8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x3e0b74);
  Container::GetCon((Container *)0x3e0b81);
  pcVar1 = BasicConstraint::name((BasicConstraint *)0x3e0b92);
  if (*pcVar1 != '\0') {
    in_stack_fffffffffffffee0 = Container::GetCon((Container *)0x3e0bb4);
    in_stack_fffffffffffffed8 = BasicConstraint::name((BasicConstraint *)0x3e0bc5);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x3e0c38);
  }
  Container::GetDepth(local_20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            (in_stack_fffffffffffffed0,(int *)in_stack_fffffffffffffec8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x3e0d29);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
  Container::GetCon((Container *)0x3e0d65);
  WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AcosId>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x3e0d87);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x3e0d94);
  return;
}

Assistant:

void WriteCon2JSON(
      fmt::MemoryWriter& wrt, int i_con, const Container& cnt) {
    MiniJSONWriter jw(wrt);
    jw["CON_TYPE"] = GetShortTypeName();
    jw["index"] = i_con;
    if (*cnt.GetCon().name())
      jw["name"] = cnt.GetCon().name();
    jw["depth"] = cnt.GetDepth();
    WriteJSON(jw["data"], cnt.GetCon());
  }